

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O2

int wally_wif_to_bytes(char *wif,uint32_t prefix,uint32_t flags,uchar *bytes_out,size_t len)

{
  int iVar1;
  int iVar2;
  size_t uncompressed;
  uchar buf [38];
  
  iVar2 = -2;
  if ((flags < 2 && wif != (char *)0x0) &&
     (len == 0x20 && (bytes_out != (uchar *)0x0 && 0xff >= prefix))) {
    iVar1 = is_uncompressed(wif,buf,(size_t)&uncompressed,
                            (size_t *)
                            CONCAT71((int7)((ulong)bytes_out >> 8),
                                     bytes_out == (uchar *)0x0 || 0xff < prefix));
    iVar2 = -2;
    if ((iVar1 == 0) &&
       (((buf[0] == prefix && (flags == 1 || uncompressed == 0)) &&
        (flags == 0 || uncompressed != 0)))) {
      *(undefined8 *)(bytes_out + 0x10) = buf._17_8_;
      *(undefined8 *)(bytes_out + 0x18) = buf._25_8_;
      *(undefined8 *)bytes_out = buf._1_8_;
      *(undefined8 *)(bytes_out + 8) = buf._9_8_;
      iVar2 = 0;
    }
    wally_clear(buf,0x26);
  }
  return iVar2;
}

Assistant:

int wally_wif_to_bytes(const char *wif,
                       uint32_t prefix,
                       uint32_t flags,
                       unsigned char *bytes_out,
                       size_t len)
{
    int ret;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];
    size_t uncompressed;

    if (!wif || (flags & ~WIF_ALL_DEFINED_FLAGS) || (prefix & ~0xff) ||
        !bytes_out || len != EC_PRIVATE_KEY_LEN)
        return WALLY_EINVAL;

    ret = is_uncompressed(wif, buf, sizeof(buf), &uncompressed);

    if (ret != WALLY_OK ||
        (buf[0] != prefix) ||
        (uncompressed && flags != WALLY_WIF_FLAG_UNCOMPRESSED) ||
        (!uncompressed && flags != WALLY_WIF_FLAG_COMPRESSED)) {
        wally_clear(buf, sizeof(buf));
        return WALLY_EINVAL; /** Incorrect format, prefix does not match or inconsistent flag */
    }

    memcpy(bytes_out, &buf[1], EC_PRIVATE_KEY_LEN);

    wally_clear(buf, sizeof(buf));
    return WALLY_OK;
}